

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *p;
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  PolicyStatus PVar6;
  int iVar7;
  string *psVar8;
  char *pcVar9;
  undefined8 uVar10;
  code *pcVar11;
  uint7 extraout_var_00;
  ostream *poVar12;
  long *plVar13;
  code *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  PolicyID id;
  ulong uVar16;
  pointer pbVar17;
  undefined8 uVar18;
  _Any_data *__s;
  uint uVar19;
  string *i;
  long lVar20;
  string vv;
  string vs;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string msg;
  string bindir;
  string srcdir;
  string homepage;
  string description;
  string version;
  uint v [4];
  RegularExpression vx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  undefined1 local_3b8 [32];
  code *local_398;
  string local_390;
  _Alloc_hider local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  _Any_data local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [3];
  char local_308 [48];
  ios_base local_2d8 [16];
  char local_2c8 [64];
  char local_288 [184];
  ulong local_1d0;
  string local_1c8;
  ulong local_1a8;
  ulong local_1a0;
  string local_198;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined7 uStack_167;
  char *local_158;
  undefined8 local_150;
  char local_148;
  undefined7 uStack_147;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  uint local_118 [2];
  undefined8 uStack_110;
  undefined1 local_100 [80];
  char *local_b0;
  char *local_60;
  char *local_40;
  uint7 extraout_var;
  
  local_348._M_unused._M_object = local_338;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"PROJECT called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    return false;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"CMAKE_PROJECT_INCLUDE_BEFORE","");
  bVar3 = IncludeByVariable(this,(string *)&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_unused._0_8_ != local_338) {
    operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1));
  }
  if (!bVar3) {
    return false;
  }
  p = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,p);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (p->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + p->_M_string_length);
  std::__cxx11::string::append((char *)&local_1c8);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar1 = (p->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar1,pcVar1 + p->_M_string_length);
  std::__cxx11::string::append((char *)&local_198);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddCacheDefinition
            (pcVar2,&local_1c8,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddCacheDefinition
            (pcVar2,&local_198,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::_M_replace((ulong)&local_1c8,0,(char *)local_1c8._M_string_length,0x55cba3);
  std::__cxx11::string::_M_replace((ulong)&local_198,0,(char *)local_198._M_string_length,0x55cbb6);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_1c8,(psVar8->_M_dataplus)._M_p);
  pcVar2 = (this->super_cmCommand).Makefile;
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_198,(psVar8->_M_dataplus)._M_p);
  pcVar2 = (this->super_cmCommand).Makefile;
  local_348._M_unused._M_object = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"PROJECT_NAME","");
  cmMakefile::AddDefinition(pcVar2,(string *)&local_348,(p->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_unused._0_8_ != local_338) {
    operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1));
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_348._M_unused._M_object = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"CMAKE_PROJECT_NAME","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)&local_348);
  if (pcVar9 == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
LAB_0029134d:
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_348,(p->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddCacheDefinition
              (pcVar2,(string *)&local_348,(p->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,
               false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    bVar3 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    if (bVar3) goto LAB_0029134d;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  bVar3 = false;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_158 = &local_148;
  local_150 = 0;
  local_148 = '\0';
  local_178 = &local_168;
  local_170 = 0;
  local_168 = '\0';
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370._M_p = (pointer)&local_3d8;
  local_3c8 = (code *)0x0;
  pcStack_3c0 = (code *)0x0;
  local_3d8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_3d8._8_8_ = (_Alloc_hider *)0x0;
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = 0;
  local_1a8 = 0;
  pcVar14 = (code *)0x0;
  local_398 = (code *)0x0;
  uVar19 = 0;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17)) {
    iVar7 = 2;
    uVar16 = 1;
    lVar20 = 0x20;
    local_1a0 = 0;
    local_398 = (code *)0x0;
    local_1a8 = 0;
    local_1d0 = 0;
    bVar3 = false;
    do {
      iVar5 = std::__cxx11::string::compare((char *)((long)&(pbVar17->_M_dataplus)._M_p + lVar20));
      if (iVar5 == 0) {
        if (((ulong)local_398 & 1) != 0) {
          pcVar2 = (this->super_cmCommand).Makefile;
          local_348._M_unused._M_object = local_338;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_348,"LANGUAGES may be specified at most once.","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
          goto LAB_00292669;
        }
        if (local_3c8 != (code *)0x0) {
          (*pcStack_3c0)(&local_3d8);
        }
        pcVar14 = (code *)CONCAT71((int7)((ulong)pcVar14 >> 8),1);
        iVar7 = 2;
        local_398 = pcVar14;
        if (local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_348._M_unused._M_object = local_338;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_348,
                     "the following parameters must be specified after LANGUAGES keyword: ","");
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_100,&local_368,", ");
          std::__cxx11::string::_M_append(local_348._M_pod_data,local_100._0_8_);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          }
          std::__cxx11::string::push_back((char)&local_348);
          cmMakefile::IssueMessage((this->super_cmCommand).Makefile,WARNING,(string *)&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_unused._0_8_ != local_338) {
            operator_delete(local_348._M_unused._M_object,
                            (ulong)(local_338[0]._M_allocated_capacity + 1));
          }
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar20));
        if (iVar5 == 0) {
          if ((local_1a0 & 1) != 0) {
            pcVar2 = (this->super_cmCommand).Makefile;
            local_348._M_unused._M_object = local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_348,"VERSION may be specified at most once.","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
            goto LAB_00292669;
          }
          if (local_3c8 != (code *)0x0) {
            (*pcStack_3c0)(&local_3d8);
          }
          pcVar11 = local_3c8;
          local_348._M_unused._M_object = local_3d8._M_unused._M_object;
          local_348._8_8_ = local_3d8._8_8_;
          local_3d8._8_8_ = &local_370;
          local_338[0]._M_allocated_capacity = local_3c8;
          local_3c8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:127:29)>
                      ::_M_manager;
          local_338[0]._8_8_ = pcStack_3c0;
          pcVar14 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:127:29)>
                    ::_M_invoke;
          pcStack_3c0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:127:29)>
                        ::_M_invoke;
          local_3d8._M_unused._M_object = this;
          if (pcVar11 != (code *)0x0) {
            (*pcVar11)(&local_348,&local_348,__destroy_functor);
            pcVar11 = (code *)((ulong)extraout_var << 8);
          }
          local_1a0 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
          iVar7 = 3;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar20));
          if (iVar5 == 0) {
            if (bVar3) {
              pcVar2 = (this->super_cmCommand).Makefile;
              local_348._M_unused._M_object = local_338;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_348,"DESCRIPTION may be specified at most once.","");
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
              goto LAB_00292669;
            }
            if (local_3c8 != (code *)0x0) {
              (*pcStack_3c0)(&local_3d8);
            }
            pcVar11 = local_3c8;
            local_348._M_unused._M_object = local_3d8._M_unused._M_object;
            local_348._8_8_ = local_3d8._8_8_;
            local_3d8._8_8_ = &local_370;
            local_338[0]._M_allocated_capacity = local_3c8;
            local_3c8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:147:29)>
                        ::_M_manager;
            local_338[0]._8_8_ = pcStack_3c0;
            pcVar14 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:147:29)>
                      ::_M_invoke;
            pcStack_3c0 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:147:29)>
                          ::_M_invoke;
            local_3d8._M_unused._M_object = this;
            if (pcVar11 != (code *)0x0) {
              (*pcVar11)(&local_348,&local_348,__destroy_functor);
            }
            iVar7 = 0;
            bVar3 = true;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar20));
            pcVar11 = local_3c8;
            if (iVar5 == 0) {
              if ((local_1d0 & 1) != 0) {
                pcVar2 = (this->super_cmCommand).Makefile;
                local_348._M_unused._M_object = local_338;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_348,"HOMEPAGE_URL may be specified at most once.","");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
                goto LAB_00292669;
              }
              local_348._M_unused._M_object = local_3d8._M_unused._M_object;
              local_348._8_8_ = local_3d8._8_8_;
              local_3d8._8_8_ = &local_370;
              local_338[0]._M_allocated_capacity = local_3c8;
              local_3c8 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:164:29)>
                          ::_M_manager;
              local_338[0]._8_8_ = pcStack_3c0;
              pcVar14 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:164:29)>
                        ::_M_invoke;
              pcStack_3c0 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:164:29)>
                            ::_M_invoke;
              local_3d8._M_unused._M_object = this;
              if (pcVar11 != (code *)0x0) {
                (*pcVar11)(&local_348,&local_348,__destroy_functor);
                pcVar11 = (code *)((ulong)extraout_var_00 << 8);
              }
              iVar7 = 1;
              local_1d0 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
            }
            else if ((uVar16 == 1) &&
                    (uVar10 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1)),
                    (int)uVar10 == 0)) {
              local_1a8 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else {
              if (iVar7 == 0) {
                std::__cxx11::string::_M_assign((string *)&local_158);
                local_338[0]._M_allocated_capacity = (code *)0x0;
                local_338[0]._8_8_ = (code *)0x0;
                local_348._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_348._8_8_ = (_Alloc_hider *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_370._M_p,(function<void_()> *)&local_348);
                if ((code *)local_338[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_338[0]._0_8_)(&local_348,&local_348,3);
                }
              }
              else if (iVar7 == 1) {
                std::__cxx11::string::_M_assign((string *)&local_178);
                local_338[0]._M_allocated_capacity = (code *)0x0;
                local_338[0]._8_8_ = (code *)0x0;
                local_348._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_348._8_8_ = (_Alloc_hider *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_370._M_p,(function<void_()> *)&local_348);
                if ((code *)local_338[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_338[0]._0_8_)(&local_348,&local_348,3);
                }
              }
              else {
                if (iVar7 != 3) {
                  iVar7 = 2;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_368,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar20));
                  goto LAB_002919e7;
                }
                std::__cxx11::string::_M_assign((string *)&local_138);
                local_338[0]._M_allocated_capacity = (code *)0x0;
                local_338[0]._8_8_ = (code *)0x0;
                local_348._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_348._8_8_ = (_Alloc_hider *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_370._M_p,(function<void_()> *)&local_348);
                if ((code *)local_338[0]._0_8_ != (code *)0x0) {
                  (*(code *)local_338[0]._0_8_)(&local_348,&local_348,3);
                }
              }
              iVar7 = 2;
            }
          }
        }
      }
LAB_002919e7:
      uVar16 = uVar16 + 1;
      pbVar17 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x20;
    } while (uVar16 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17 >> 5
                             ));
    uVar19 = (uint)local_1a0;
  }
  if (local_3c8 != (code *)0x0) {
    (*pcStack_3c0)(&local_3d8);
  }
  if ((((~(bVar3 | (byte)uVar19 | (byte)local_1d0) | (byte)local_398) & 1) == 0) &&
     (local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
LAB_00292669:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    cmSystemTools::s_FatalErrorOccured = true;
    bVar3 = true;
  }
  else {
    if ((((ulong)local_398 & 1) != 0) &&
       (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368,
                 (char (*) [5])0x59fca1);
    }
    PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0048,false);
    if ((uVar19 & 1) == 0) {
      if (PVar6 != OLD) {
        local_3b8._0_8_ = (string *)0x0;
        local_3b8._8_8_ = (string *)0x0;
        local_3b8._16_8_ = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (char (*) [16])0x55cd87);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (char (*) [22])0x55cd9d);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (char (*) [22])0x55cdb9);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (char (*) [22])0x55cdd5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (char (*) [22])0x55cdf1);
        pcVar1 = (p->_M_dataplus)._M_p;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
        std::__cxx11::string::append(local_348._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) {
          operator_delete(local_348._M_unused._M_object,
                          (ulong)(local_338[0]._M_allocated_capacity + 1));
        }
        pcVar1 = (p->_M_dataplus)._M_p;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
        std::__cxx11::string::append(local_348._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) {
          operator_delete(local_348._M_unused._M_object,
                          (ulong)(local_338[0]._M_allocated_capacity + 1));
        }
        pcVar1 = (p->_M_dataplus)._M_p;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
        std::__cxx11::string::append(local_348._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) {
          operator_delete(local_348._M_unused._M_object,
                          (ulong)(local_338[0]._M_allocated_capacity + 1));
        }
        pcVar1 = (p->_M_dataplus)._M_p;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
        std::__cxx11::string::append(local_348._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) {
          operator_delete(local_348._M_unused._M_object,
                          (ulong)(local_338[0]._M_allocated_capacity + 1));
        }
        pcVar1 = (p->_M_dataplus)._M_p;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
        std::__cxx11::string::append(local_348._M_pod_data);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) {
          operator_delete(local_348._M_unused._M_object,
                          (ulong)(local_338[0]._M_allocated_capacity + 1));
        }
        bVar3 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
        if (bVar3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        uVar10 = local_3b8._8_8_;
        local_100._0_8_ = local_100 + 0x10;
        local_100._8_8_ = (char *)0x0;
        local_100[0x10] = '\0';
        if (local_3b8._0_8_ != local_3b8._8_8_) {
          psVar8 = (string *)local_3b8._0_8_;
          do {
            pcVar9 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,psVar8);
            if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
              if (PVar6 == WARN) {
                if ((local_1a8 & 1) == 0) {
                  std::__cxx11::string::append(local_100);
                  std::__cxx11::string::_M_append(local_100,(ulong)(psVar8->_M_dataplus)._M_p);
                }
              }
              else {
                cmMakefile::AddDefinition((this->super_cmCommand).Makefile,psVar8,"");
              }
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != (string *)uVar10);
        }
        if ((char *)local_100._8_8_ != (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348._M_pod_data);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_390,(cmPolicies *)0x30,id);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_348,local_390._M_dataplus._M_p,
                               local_390._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\nThe following variable(s) would be set to empty:",0x31);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,(char *)local_100._0_8_,local_100._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,
                            CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                     local_390.field_2._M_local_buf[0]) + 1);
          }
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_390);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,
                            CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                     local_390.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348._M_pod_data);
          std::ios_base::~ios_base(local_2d8);
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b8);
      }
    }
    else {
      if (PVar6 < NEW) {
        pcVar2 = (this->super_cmCommand).Makefile;
        local_348._M_unused._M_object = local_338;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_348,"VERSION not allowed unless CMP0048 is set to NEW","");
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_348);
        goto LAB_00292669;
      }
      local_100._0_8_ = (char *)0x0;
      local_b0 = (char *)0x0;
      local_60 = (char *)0x0;
      local_40 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_100,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      cVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_100,local_138._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_100);
      if ((bool)cVar4) {
        local_398 = (code *)CONCAT71(local_398._1_7_,cVar4);
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        local_390._M_string_length = 0;
        local_390.field_2._M_local_buf[0] = '\0';
        local_118[0] = 0;
        local_118[1] = 0;
        uStack_110 = 0;
        iVar7 = __isoc99_sscanf(local_138._M_dataplus._M_p,"%u.%u.%u.%u",local_118,local_118 + 1,
                                &uStack_110,(long)&uStack_110 + 4);
        lVar20 = 0;
        __s = &local_348;
        do {
          if (lVar20 < iVar7) {
            sprintf(__s->_M_pod_data,"%u",(ulong)local_118[lVar20]);
            std::__cxx11::string::append((char *)&local_390);
            std::__cxx11::string::append((char *)&local_390);
          }
          else {
            __s->_M_pod_data[0] = '\0';
          }
          lVar20 = lVar20 + 1;
          __s = (_Any_data *)(__s->_M_pod_data + 0x40);
        } while (lVar20 != 4);
        local_3b8._0_8_ = local_3b8 + 0x10;
        local_3b8._8_8_ = (string *)0x0;
        local_3b8._16_8_ = local_3b8._16_8_ & 0xffffffffffffff00;
        std::operator+(&local_3f8,p,"_VERSION");
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_3f8);
        paVar15 = &local_3f8.field_2;
        cVar4 = (byte)local_398;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        local_3f8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"PROJECT_VERSION","");
        cmMakefile::AddDefinition(pcVar2,&local_3f8,local_390._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)local_3b8,local_390._M_dataplus._M_p);
        std::operator+(&local_3f8,p,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        local_3f8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"PROJECT_VERSION_MAJOR","");
        cmMakefile::AddDefinition(pcVar2,&local_3f8,local_348._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)local_3b8,local_348._M_pod_data);
        std::operator+(&local_3f8,p,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        local_3f8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"PROJECT_VERSION_MINOR","");
        cmMakefile::AddDefinition(pcVar2,&local_3f8,local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_3b8,local_308);
        std::operator+(&local_3f8,p,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        local_3f8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"PROJECT_VERSION_PATCH","");
        cmMakefile::AddDefinition(pcVar2,&local_3f8,local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_3b8,local_2c8);
        std::operator+(&local_3f8,p,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmCommand).Makefile;
        local_3f8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"PROJECT_VERSION_TWEAK","");
        cmMakefile::AddDefinition(pcVar2,&local_3f8,local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_3b8,local_288);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION",local_390._M_dataplus._M_p);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MAJOR",local_348._M_pod_data);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MINOR",local_308);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_PATCH",local_2c8);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_TWEAK",local_288);
        if ((string *)local_3b8._0_8_ != (string *)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          uVar10 = (code *)CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                    local_390.field_2._M_local_buf[0]);
          uVar18 = local_390._M_dataplus._M_p;
LAB_0029271f:
          operator_delete((void *)uVar18,(ulong)(uVar10 + 1));
        }
      }
      else {
        std::operator+(&local_390,"VERSION \"",&local_138);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_390);
        local_348._M_unused._M_object = local_338;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar15) {
          local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_338[0]._8_8_ = plVar13[3];
        }
        else {
          local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_348._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar13;
        }
        local_348._8_8_ = plVar13[1];
        *plVar13 = (long)paVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,
                          CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                   local_390.field_2._M_local_buf[0]) + 1);
        }
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)&local_348);
        cmSystemTools::s_FatalErrorOccured = true;
        uVar10 = local_338[0]._M_allocated_capacity;
        uVar18 = local_348._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_unused._0_8_ != local_338) goto LAB_0029271f;
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      bVar3 = true;
      if (cVar4 == '\0') goto LAB_00292ab8;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"PROJECT_DESCRIPTION","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_348,local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    pcVar1 = (p->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
    std::__cxx11::string::append(local_348._M_pod_data);
    cmMakefile::AddDefinition(pcVar2,(string *)&local_348,local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_DESCRIPTION",local_158);
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"PROJECT_HOMEPAGE_URL","");
    cmMakefile::AddDefinition(pcVar2,(string *)&local_348,local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_348._M_unused._M_object = local_338;
    pcVar1 = (p->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar1,pcVar1 + p->_M_string_length);
    std::__cxx11::string::append(local_348._M_pod_data);
    cmMakefile::AddDefinition(pcVar2,(string *)&local_348,local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_HOMEPAGE_URL",local_178);
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368,
                 (char (*) [2])0x53c23d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368,
                 (char (*) [4])0x543392);
    }
    cmMakefile::EnableLanguage((this->super_cmCommand).Makefile,&local_368,false);
    local_348._M_unused._M_object = local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"CMAKE_PROJECT_INCLUDE","")
    ;
    bVar3 = IncludeByVariable(this,(string *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_unused._0_8_ != local_338) {
      operator_delete(local_348._M_unused._M_object,(ulong)(local_338[0]._M_allocated_capacity + 1))
      ;
    }
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     "CMAKE_PROJECT_",p);
      plVar13 = (long *)std::__cxx11::string::append(local_100);
      local_348._M_unused._M_object = local_338;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar15) {
        local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_338[0]._8_8_ = plVar13[3];
      }
      else {
        local_338[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_348._M_unused._M_object =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar13;
      }
      local_348._8_8_ = plVar13[1];
      *plVar13 = (long)paVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      bVar3 = IncludeByVariable(this,(string *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_unused._0_8_ != local_338) {
        operator_delete(local_348._M_unused._M_object,
                        (ulong)(local_338[0]._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
      }
    }
    else {
      bVar3 = false;
    }
  }
LAB_00292ab8:
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}